

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.h
# Opt level: O1

void __thiscall cfd::core::DescriptorKeyInfo::~DescriptorKeyInfo(DescriptorKeyInfo *this)

{
  pointer pcVar1;
  pointer puVar2;
  
  pcVar1 = (this->key_string_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->key_string_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->path_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->parent_info_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->parent_info_).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->extpubkey_).tweak_sum_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extpubkey_).pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extpubkey_).chaincode_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extpubkey_).serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extprivkey_).tweak_sum_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extprivkey_).privkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extprivkey_).chaincode_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extprivkey_).serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->privkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->schnorr_pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

class CFD_CORE_EXPORT DescriptorKeyInfo {
 public:
  /**
   * @brief Get extkey text information from ext-privkey.
   * @param[in] ext_privkey  privkey
   * @param[in] child_path   bip32 path for child.
   * @return extkey text information.
   */
  static std::string GetExtPrivkeyInformation(
      const ExtPrivkey& ext_privkey, const std::string& child_path);
  /**
   * @brief Get extkey text information from ext-pubkey.
   * @param[in] ext_pubkey   pubkey
   * @param[in] child_path   bip32 path for child.
   * @return extkey text information.
   */
  static std::string GetExtPubkeyInformation(
      const ExtPubkey& ext_pubkey, const std::string& child_path);
  /**
   * @brief constructor.
   */
  DescriptorKeyInfo();
  /**
   * @brief constructor.
   * @param[in] key         key information.
   * @param[in] parent_key_information  parent key info.
   */
  explicit DescriptorKeyInfo(
      const std::string& key, const std::string parent_key_information = "");
  /**
   * @brief constructor.
   * @param[in] pubkey      pubkey
   * @param[in] parent_key_information  parent key info.
   */
  explicit DescriptorKeyInfo(
      const Pubkey& pubkey, const std::string parent_key_information = "");
  /**
   * @brief constructor.
   * @param[in] schnorr_pubkey          pubkey
   * @param[in] parent_key_information  parent key info.
   */
  explicit DescriptorKeyInfo(
      const SchnorrPubkey& schnorr_pubkey,
      const std::string parent_key_information = "");
  /**
   * @brief constructor.
   * @param[in] privkey     privkey
   * @param[in] use_wif_parameter   WIF output flag.
   *   using net_type and is_compressed.
   * @param[in] net_type    Mainnet or Testnet
   * @param[in] is_compressed  compressed pubkey flag.
   * @param[in] parent_key_information  parent key info.
   */
  explicit DescriptorKeyInfo(
      const Privkey& privkey, bool use_wif_parameter = false,
      NetType net_type = NetType::kMainnet, bool is_compressed = true,
      const std::string parent_key_information = "");
  /**
   * @brief constructor.
   * @param[in] ext_privkey   ext privkey
   * @param[in] parent_key_information  parent key info.
   * @param[in] path          path string.
   */
  explicit DescriptorKeyInfo(
      const ExtPrivkey& ext_privkey,
      const std::string parent_key_information = "",
      const std::string path = "");
  /**
   * @brief constructor.
   * @param[in] ext_pubkey   ext pubkey
   * @param[in] parent_key_information  parent key info.
   * @param[in] path          path string.
   */
  explicit DescriptorKeyInfo(
      const ExtPubkey& ext_pubkey,
      const std::string parent_key_information = "",
      const std::string path = "");
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorKeyReference object
   */
  explicit DescriptorKeyInfo(const DescriptorKeyInfo& object);
  /**
   * @brief copy constructor.
   * @param[in] object    DescriptorKeyReference object
   * @return DescriptorKeyReference object
   */
  DescriptorKeyInfo& operator=(const DescriptorKeyInfo& object);

  /**
   * @brief getting pubkey.
   * @return pubkey
   */
  Pubkey GetPubkey() const;
  /**
   * @brief getting schnorr pubkey.
   * @return pubkey
   */
  SchnorrPubkey GetSchnorrPubkey() const;
  /**
   * @brief getting privkey.
   * @return privkey
   */
  Privkey GetPrivkey() const;
  /**
   * @brief getting bip32 path.
   * @return bip32 path
   */
  std::string GetBip32Path() const;
  /**
   * @brief exist ext-privkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPrivkey() const;
  /**
   * @brief exist ext-pubkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasExtPubkey() const;
  /**
   * @brief exist privkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasPrivkey() const;
  /**
   * @brief exist schnorr pubkey.
   * @retval true  exist
   * @retval false not exist
   */
  bool HasSchnorrPubkey() const;
  /**
   * @brief getting ext-privkey.
   * @details need ext-privkey exists.
   * @return ext-privkey
   */
  ExtPrivkey GetExtPrivkey() const;
  /**
   * @brief getting ext-pubkey.
   * @details need ext-pubkey exists.
   * @return ext-pubkey
   */
  ExtPubkey GetExtPubkey() const;
  /**
   * @brief getting key type.
   * @return key type
   */
  DescriptorKeyType GetKeyType() const;
  /**
   * @brief get message string.
   * @return message string.
   */
  std::string ToString() const;

 private:
  DescriptorKeyType key_type_;    //!< node key type
  SchnorrPubkey schnorr_pubkey_;  //!< schnorr pubkey
  Pubkey pubkey_;                 //!< pubkey
  Privkey privkey_;               //!< privkey
  ExtPrivkey extprivkey_;         //!< ext privkey
  ExtPubkey extpubkey_;           //!< ext pubkey
  std::string parent_info_;       //!< parent info
  std::string path_;              //!< bip32 path
  std::string key_string_;        //!< key string
}